

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ObjFanin2Copy(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint *puVar3;
  
  if (p->pMuxes == (uint *)0x0) {
    uVar2 = 0;
    puVar3 = (uint *)&DAT_00000008;
  }
  else {
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar2 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555];
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (p->nObjs <= (int)(uVar2 >> 1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    puVar3 = &pGVar1[uVar2 >> 1].Value;
    uVar2 = uVar2 & 1;
  }
  if (-1 < (int)*puVar3) {
    return uVar2 ^ *puVar3;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

static inline int          Gia_ObjFanin2Copy( Gia_Man_t * p, Gia_Obj_t * pObj ){ return Abc_LitNotCond(Gia_ObjFanin2(p, pObj)->Value, Gia_ObjFaninC2(p, pObj)); }